

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O1

string * __thiscall
zsummer::log4z::CLogerManager::GetExampleConfig_abi_cxx11_
          (string *__return_storage_ptr__,CLogerManager *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "[FileConfig]\n#path=./log/\n#level=DEBUG\n#display=true\n#monthdir=false\n#limit=100\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string GetExampleConfig()
	{
		return ""
			"[FileConfig]\n"
			"#path=./log/\n"
			"#level=DEBUG\n"
			"#display=true\n"
			"#monthdir=false\n"
			"#limit=100\n";
	}